

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall spvtools::opt::IRContext::KillNamesAndDecorates(IRContext *this,Instruction *inst)

{
  uint32_t id;
  
  if (inst->has_result_id_ == true) {
    id = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    if (id != 0) {
      KillNamesAndDecorates(this,id);
      return;
    }
  }
  return;
}

Assistant:

void IRContext::CollectNonSemanticTree(
    Instruction* inst, std::unordered_set<Instruction*>* to_kill) {
  if (!inst->HasResultId()) return;
  // Debug[No]Line result id is not used, so we are done
  if (inst->IsDebugLineInst()) return;
  std::vector<Instruction*> work_list;
  std::unordered_set<Instruction*> seen;
  work_list.push_back(inst);

  while (!work_list.empty()) {
    auto* i = work_list.back();
    work_list.pop_back();
    get_def_use_mgr()->ForEachUser(
        i, [&work_list, to_kill, &seen](Instruction* user) {
          if (user->IsNonSemanticInstruction() && seen.insert(user).second) {
            work_list.push_back(user);
            to_kill->insert(user);
          }
        });
  }
}